

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O0

int PlatformSpecificSetJmpImplementation(_func_void_void_ptr *function,void *data)

{
  int iVar1;
  undefined8 in_RSI;
  code *in_RDI;
  uint local_4;
  
  iVar1 = _setjmp((__jmp_buf_tag *)(test_exit_jmp_buf + jmp_buf_index));
  if (iVar1 == 0) {
    jmp_buf_index = jmp_buf_index + 1;
    (*in_RDI)(in_RSI);
    jmp_buf_index = jmp_buf_index + -1;
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int PlatformSpecificSetJmpImplementation(void (*function) (void* data), void* data)
{
    if (0 == setjmp(test_exit_jmp_buf[jmp_buf_index])) {
        jmp_buf_index++;
        function(data);
        jmp_buf_index--;
        return 1;
    }
    return 0;
}